

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QScrollerPrivate::ScrollSegment>::copyAppend
          (QGenericArrayOps<QScrollerPrivate::ScrollSegment> *this,ScrollSegment *b,ScrollSegment *e
          )

{
  qsizetype *pqVar1;
  ScrollSegment *pSVar2;
  
  if (b != e) {
    pSVar2 = (this->super_QArrayDataPointer<QScrollerPrivate::ScrollSegment>).ptr;
    for (; b < e; b = b + 1) {
      QScrollerPrivate::ScrollSegment::ScrollSegment
                (pSVar2 + (this->super_QArrayDataPointer<QScrollerPrivate::ScrollSegment>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QScrollerPrivate::ScrollSegment>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }